

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MetadataReader::MetadataReader
          (MetadataReader *this,MetadataManager *manager,MetaBlockPointer pointer,
          optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true> read_pointers_p,
          BlockReaderType type)

{
  vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>> *this_00;
  iterator __position;
  idx_t iVar1;
  undefined8 extraout_RDX;
  MetaBlockPointer pointer_00;
  MetaBlockPointer local_30;
  
  local_30._8_8_ = pointer._8_8_;
  local_30.block_pointer = pointer.block_pointer;
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&PTR_ReadData_024abdf0;
  this->manager = manager;
  this->type = type;
  BufferHandle::BufferHandle(&(this->block).handle);
  iVar1 = local_30.block_pointer;
  pointer_00.offset = (int)extraout_RDX;
  pointer_00.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
  pointer_00.block_pointer = local_30.block_pointer;
  FromDiskPointer(this,pointer_00);
  this->next_pointer = (MetadataPointer)iVar1;
  this->has_next_block = true;
  (this->read_pointers).ptr = read_pointers_p.ptr;
  this->index = 0;
  this->offset = 0;
  this->next_offset = local_30._8_8_ & 0xffffffff;
  this->capacity = 0;
  if (read_pointers_p.ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
    optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::CheckValid
              (&this->read_pointers);
    this_00 = (vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>> *)
              (this->read_pointers).ptr;
    __position._M_current = *(MetaBlockPointer **)(this_00 + 8);
    if (__position._M_current == *(MetaBlockPointer **)(this_00 + 0x10)) {
      ::std::vector<duckdb::MetaBlockPointer,std::allocator<duckdb::MetaBlockPointer>>::
      _M_realloc_insert<duckdb::MetaBlockPointer_const&>(this_00,__position,&local_30);
    }
    else {
      (__position._M_current)->block_pointer = local_30.block_pointer;
      (__position._M_current)->offset = local_30.offset;
      (__position._M_current)->unused_padding = local_30.unused_padding;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
    }
  }
  return;
}

Assistant:

MetadataReader::MetadataReader(MetadataManager &manager, MetaBlockPointer pointer,
                               optional_ptr<vector<MetaBlockPointer>> read_pointers_p, BlockReaderType type)
    : manager(manager), type(type), next_pointer(FromDiskPointer(pointer)), has_next_block(true),
      read_pointers(read_pointers_p), index(0), offset(0), next_offset(pointer.offset), capacity(0) {
	if (read_pointers) {
		D_ASSERT(read_pointers->empty());
		read_pointers->push_back(pointer);
	}
}